

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

ModelPtr commonSetupImportedUnits(void)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDI;
  ModelPtr MVar8;
  AssertHelper local_200 [8];
  Message local_1f8 [8];
  unsigned_long local_1f0 [2];
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1b0 [8];
  Message local_1a8 [15];
  allocator<char> local_199;
  string local_198 [32];
  shared_ptr<libcellml::Units> local_178;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_130 [8];
  Message local_128 [15];
  allocator<char> local_119;
  string local_118 [32];
  shared_ptr<libcellml::Units> local_f8;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_;
  string local_c8 [32];
  undefined1 local_a8 [8];
  ImportSourcePtr import;
  string local_90 [32];
  undefined1 local_70 [8];
  UnitsPtr myImportedUnits;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  UnitsPtr myConcreteUnits;
  ModelPtr *model;
  
  myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._7_1_ = 0;
  libcellml::Model::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"myConcreteUnits",&local_49);
  libcellml::Units::create((string *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"myImportedUnits",
             (allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Units::create((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&import.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"import.cellml",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(peVar4 + 0x10));
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  peVar5 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDI);
  libcellml::Model::addUnits((shared_ptr *)peVar5);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_118,"myImportedUnits",&local_119);
  libcellml::Model::units((string *)&local_f8);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_f8);
  bVar1 = libcellml::ImportedEntity::isImport();
  local_e1 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_e0,
               "model->units(\"myImportedUnits\")->isImport()","false");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x340,pcVar6);
    testing::internal::AssertHelper::operator=(local_130,local_128);
    testing::internal::AssertHelper::~AssertHelper(local_130);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"myConcreteUnits",&local_199);
  libcellml::Model::units((string *)&local_178);
  std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_178);
  bVar1 = libcellml::ImportedEntity::isImport();
  local_161 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_160,&local_161,(type *)0x0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar2) {
    testing::Message::Message(local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_160,
               "model->units(\"myConcreteUnits\")->isImport()","true");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x341,pcVar6);
    testing::internal::AssertHelper::operator=(local_1b0,local_1a8);
    testing::internal::AssertHelper::~AssertHelper(local_1b0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  local_1f0[1] = 2;
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (in_RDI);
  local_1f0[0] = libcellml::Model::unitsCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1e0,"size_t(2)","model->unitsCount()",local_1f0 + 1,local_1f0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar2) {
    testing::Message::Message(local_1f8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x343,pcVar6);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._7_1_ = 1;
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_a8);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_70);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_28);
  _Var7._M_pi = extraout_RDX;
  if ((myConcreteUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._7_1_ & 1) == 0) {
    std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)in_RDI);
    _Var7._M_pi = extraout_RDX_00;
  }
  MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ModelPtr)MVar8.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr commonSetupImportedUnits()
{
    auto model = libcellml::Model::create();
    auto myConcreteUnits = libcellml::Units::create("myConcreteUnits");
    auto myImportedUnits = libcellml::Units::create("myImportedUnits");

    auto import = libcellml::ImportSource::create();
    import->setUrl("import.cellml");
    myImportedUnits->setImportSource(import);

    model->addUnits(myConcreteUnits);
    model->addUnits(myImportedUnits);

    EXPECT_TRUE(model->units("myImportedUnits")->isImport());
    EXPECT_FALSE(model->units("myConcreteUnits")->isImport());

    EXPECT_EQ(size_t(2), model->unitsCount());

    return model;
}